

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

bool __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::rd_string
          (uintwide_t<256U,_unsigned_short,_void,_true> *this,char *str_input,
          unsigned_fast_type count,int base_hint)

{
  ushort uVar1;
  unsigned_long uVar2;
  iterator puVar3;
  iterator last;
  unsigned_long uVar4;
  ushort uVar5;
  ulong uVar6;
  bool bVar7;
  bool local_93;
  bool local_92;
  bool local_8f;
  bool local_8b;
  byte local_8a;
  bool local_89;
  unsigned_long local_88;
  byte local_64;
  undefined1 local_60 [4];
  uint8_t uc_hex;
  bool char_is_0_to_9;
  bool char_is_a_to_f_hi;
  bool char_is_a_to_f_lo;
  uchar local_40;
  byte local_3f;
  undefined1 local_3e;
  char local_3d;
  bool local_3c;
  bool local_3b;
  char local_3a;
  byte local_39;
  uint8_t uc_dec;
  uint8_t uc_oct;
  bool char_is_apostrophe;
  char c;
  bool char_is_valid;
  bool might_be_oct_or_hex;
  uint_fast8_t base;
  bool str_has_neg_sign;
  unsigned_fast_type pos;
  unsigned_fast_type str_length;
  unsigned_fast_type uStack_20;
  int base_hint_local;
  unsigned_fast_type count_local;
  char *str_input_local;
  uintwide_t<256U,_unsigned_short,_void,_true> *this_local;
  
  str_length._4_4_ = base_hint;
  uStack_20 = count;
  count_local = (unsigned_fast_type)str_input;
  str_input_local = (char *)this;
  puVar3 = detail::array_detail::array<unsigned_short,_16UL>::begin
                     ((array<unsigned_short,_16UL> *)this);
  last = detail::array_detail::array<unsigned_short,_16UL>::end((array<unsigned_short,_16UL> *)this)
  ;
  detail::fill_unsafe<unsigned_short*,unsigned_short>(puVar3,last,0);
  uVar2 = uStack_20;
  uVar4 = std::numeric_limits<unsigned_long>::max();
  if (uVar2 == uVar4) {
    local_88 = detail::strlen_unsafe((char *)count_local);
  }
  else {
    local_88 = uStack_20;
  }
  pos = local_88;
  _uc_dec = 0;
  if ((local_88 != 0) && (*(char *)count_local == '+')) {
    _uc_dec = 1;
  }
  local_39 = 0;
  if ((local_88 != 0) && (*(char *)count_local == '-')) {
    local_39 = 1;
    _uc_dec = _uc_dec + 1;
  }
  local_3a = (char)str_length._4_4_;
  if ((local_3a == '\0') && (local_3a = '\n', _uc_dec < local_88)) {
    bVar7 = *(char *)(count_local + _uc_dec) == '0';
    local_89 = bVar7 && _uc_dec < local_88;
    local_3b = local_89;
    if (bVar7 && _uc_dec < local_88) {
      if ((*(char *)(count_local + 1 + _uc_dec) < '0') ||
         ('8' < *(char *)(count_local + 1 + _uc_dec))) {
        if ((*(char *)(count_local + 1 + _uc_dec) == 'x') ||
           (*(char *)(count_local + 1 + _uc_dec) == 'X')) {
          local_3a = '\x10';
          _uc_dec = _uc_dec + 2;
        }
      }
      else {
        local_3a = '\b';
        _uc_dec = _uc_dec + 1;
      }
    }
  }
  local_3c = true;
  while( true ) {
    local_8a = 0;
    if (_uc_dec < pos) {
      local_8a = local_3c;
    }
    if ((local_8a & 1) == 0) break;
    uVar6 = _uc_dec + 1;
    local_3d = *(char *)(count_local + _uc_dec);
    local_3e = local_3d == '\'';
    _uc_dec = uVar6;
    if (!(bool)local_3e) {
      if (local_3a == '\b') {
        local_8b = '/' < local_3d && local_3d < '9';
        local_3c = local_8b;
        if ('/' < local_3d && local_3d < '9') {
          local_3f = local_3d - 0x30;
          uintwide_t<256u,unsigned_short,void,true>::operator<<=
                    ((uintwide_t<256u,unsigned_short,void,true> *)this,3);
          puVar3 = detail::array_detail::array<unsigned_short,_16UL>::begin
                             ((array<unsigned_short,_16UL> *)this);
          uVar1 = *puVar3;
          uVar5 = (ushort)local_3f;
          puVar3 = detail::array_detail::array<unsigned_short,_16UL>::begin
                             ((array<unsigned_short,_16UL> *)this);
          *puVar3 = uVar1 | uVar5;
        }
      }
      else if (local_3a == '\n') {
        local_8f = '/' < local_3d && local_3d < ':';
        local_3c = local_8f;
        if ('/' < local_3d && local_3d < ':') {
          local_40 = local_3d + 0xd0;
          mul_by_limb(this,10);
          uintwide_t<256u,unsigned_short,void,true>::uintwide_t<unsigned_char>(unsigned_char,std::
          enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::
          value)&&(std::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::
          digits),void>::type__
                    (local_60,local_40,
                     (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
                      *)0x0);
          operator+=(this,(uintwide_t<256U,_unsigned_short,_void,_true> *)local_60);
        }
      }
      else if (local_3a == '\x10') {
        local_92 = '/' < local_3d && local_3d < ':';
        local_93 = true;
        if ((local_3d < 'a' || 'f' < local_3d) &&
           (local_93 = true, local_3d < 'A' || 'F' < local_3d)) {
          local_93 = local_92;
        }
        local_3c = local_93;
        if (local_93 != false) {
          local_64 = 0;
          if (local_3d < 'a' || 'f' < local_3d) {
            if (local_3d < 'A' || 'F' < local_3d) {
              if ('/' < local_3d && local_3d < ':') {
                local_64 = local_3d - 0x30;
              }
            }
            else {
              local_64 = local_3d - 0x37;
            }
          }
          else {
            local_64 = local_3d + 0xa9;
          }
          uintwide_t<256u,unsigned_short,void,true>::operator<<=
                    ((uintwide_t<256u,unsigned_short,void,true> *)this,4);
          puVar3 = detail::array_detail::array<unsigned_short,_16UL>::begin
                             ((array<unsigned_short,_16UL> *)this);
          uVar1 = *puVar3;
          puVar3 = detail::array_detail::array<unsigned_short,_16UL>::begin
                             ((array<unsigned_short,_16UL> *)this);
          *puVar3 = uVar1 | local_64;
        }
      }
    }
  }
  if ((local_39 & 1) != 0) {
    negate(this);
  }
  return (bool)(local_3c & 1);
}

Assistant:

constexpr auto rd_string(const char* str_input, const unsigned_fast_type count, const int base_hint) -> bool // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
    {
      detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0)));

      const auto str_length =
        static_cast<unsigned_fast_type>
        (
          (count == (std::numeric_limits<unsigned_fast_type>::max)()) ? detail::strlen_unsafe(str_input) : count
        );

      auto pos = static_cast<unsigned_fast_type>(UINT8_C(0));

      // Detect: Is there a plus sign?
      // And if there is a plus sign, skip over the plus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '+')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        ++pos;
      }

      auto str_has_neg_sign = false;

      // Detect: Is there a minus sign?
      // And if there is a minus sign, skip over the minus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '-')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        str_has_neg_sign = true;

        ++pos;
      }

      // Set the base if the client has supplied a non-zero base-hint.
      auto base = static_cast<std::uint_fast8_t>(base_hint);

      if(base == static_cast<std::uint_fast8_t>(UINT8_C(0)))
      {
        base = static_cast<std::uint_fast8_t>(UINT8_C(10));

        // Perform a dynamic detection of the base.
        if(str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))
        {
          const auto might_be_oct_or_hex = ((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] == '0') && (str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))); // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

          if(might_be_oct_or_hex)
          {
            if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] <= '8')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is octal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(8));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)));
            }
            else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'x') || (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'X')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is hexadecimal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(16));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(2)));
            }
          }
          else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] <= '9')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
          {
            // The input format is decimal.
            ;
          }
        }
      }

      auto char_is_valid = true;

      while((pos < str_length) && char_is_valid) // NOLINT(altera-id-dependent-backward-branch)
      {
        const auto c = str_input[pos++]; // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

        const auto char_is_apostrophe = (c == static_cast<char>(39));

        if(!char_is_apostrophe)
        {
          if(base == static_cast<std::uint_fast8_t>(UINT8_C(8)))
          {
            char_is_valid = ((c >= '0') && (c <= '8'));

            if(char_is_valid)
            {
              const auto uc_oct = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(3))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_oct);
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(10)))
          {
            char_is_valid = ((c >= '0') && (c <= '9'));

            if(char_is_valid)
            {
              const auto uc_dec = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(mul_by_limb(static_cast<limb_type>(UINT8_C(10))));

              static_cast<void>(operator+=(uc_dec));
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(16)))
          {
            const auto char_is_a_to_f_lo((c >= 'a') && (c <= 'f'));
            const auto char_is_a_to_f_hi((c >= 'A') && (c <= 'F'));
            const auto char_is_0_to_9   ((c >= '0') && (c <= '9'));

            char_is_valid = (char_is_a_to_f_lo || char_is_a_to_f_hi || char_is_0_to_9);

            if(char_is_valid)
            {
              auto uc_hex = static_cast<std::uint8_t>(UINT8_C(0));

              if     (char_is_a_to_f_lo) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  87))); }
              else if(char_is_a_to_f_hi) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  55))); }
              else if(char_is_0_to_9)    { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30))); }

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(4))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_hex);
            }
          }
        }
      }

      if(str_has_neg_sign)
      {
        // Exclude this line from code coverage, even though explicit
        // test cases (search for "result_overshift_is_ok") are known
        // to cover this line.
        negate(); // LCOV_EXCL_LINE
      }

      return char_is_valid;
    }